

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bighexdump.cpp
# Opt level: O2

string * dumpraw_abi_cxx11_(string *__return_storage_ptr__,uint8_t *buf,size_t len,size_t *usedlen)

{
  size_t __n;
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,buf,buf + len);
  __n = strlen((__return_storage_ptr__->_M_dataplus)._M_p);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (__return_storage_ptr__,__n);
  uVar3 = __return_storage_ptr__->_M_string_length;
  sVar1 = len;
  if (len < uVar3) {
    sVar1 = uVar3;
  }
  for (; (uVar2 = sVar1, uVar3 < len && (uVar2 = uVar3, buf[uVar3] == '\0')); uVar3 = uVar3 + 1) {
  }
  *usedlen = uVar2;
  return __return_storage_ptr__;
}

Assistant:

std::string dumpraw(const uint8_t *buf, size_t len, size_t &usedlen)
{
    std::string str((const char*)buf, len);
    str.resize(strlen(str.c_str()));
    size_t i= str.size();
    while (i<len && buf[i]==0) i++;

    usedlen= i;

    return str;
}